

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::check_resource_write
          (OpCodePreprocessor *this,uint32_t var_id)

{
  bool bVar1;
  SPIRVariable *pSVar2;
  StorageClass local_34;
  StorageClass sc;
  SPIRVariable *p_var;
  uint32_t var_id_local;
  OpCodePreprocessor *this_local;
  
  pSVar2 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,var_id);
  if (pSVar2 == (SPIRVariable *)0x0) {
    local_34 = StorageClassMax;
  }
  else {
    local_34 = pSVar2->storage;
  }
  bVar1 = Options::supports_msl_version(&this->compiler->msl_options,2,1,0);
  if ((!bVar1) && ((local_34 == StorageClassUniform || (local_34 == StorageClassStorageBuffer)))) {
    this->uses_resource_write = true;
  }
  return;
}

Assistant:

void CompilerMSL::OpCodePreprocessor::check_resource_write(uint32_t var_id)
{
	auto *p_var = compiler.maybe_get_backing_variable(var_id);
	StorageClass sc = p_var ? p_var->storage : StorageClassMax;
	if (!compiler.msl_options.supports_msl_version(2, 1) &&
	    (sc == StorageClassUniform || sc == StorageClassStorageBuffer))
		uses_resource_write = true;
}